

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    char source[100];
#include "scanf_testcases.h"
#endif
    return TEST_RESULTS;
}